

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  char *__s;
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  bool bVar18;
  bool bVar19;
  ushort uVar20;
  size_t sVar21;
  uint64_t uVar22;
  ctrl_t *pcVar23;
  slot_type *psVar24;
  ctrl_t *pcVar25;
  size_t sVar26;
  uint uVar27;
  PolicyFunctions *in_R9;
  uchar *bytes;
  ulong uVar28;
  size_t cap;
  ulong uVar29;
  ulong uVar30;
  CommonFields *common;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  iterator iVar38;
  FindInfo target;
  __m128i match;
  ctrl_t local_98;
  ctrl_t cStack_97;
  ctrl_t cStack_96;
  ctrl_t cStack_95;
  anon_union_8_1_a8a14541_for_iterator_2 local_78;
  ctrl_t *local_70;
  char **local_40;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_38;
  ctrl_t cVar31;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                 );
  }
  if (*(long *)this == 0) {
LAB_00186e14:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)this);
  __s = *key;
  sVar21 = strlen(__s);
  uVar22 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,__s,sVar21);
  uVar1 = *(ulong *)this;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar30 = (uVar22 ^ sVar21) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 | (uVar30 & 0xff0000000000) >> 0x18
            | (uVar30 & 0xff00000000) >> 8 | (uVar30 & 0xff000000) << 8 |
            (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
  uVar28 = ((ulong)common >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar1;
  pcVar23 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)this);
  uVar17 = (undefined1)(uVar30 >> 0x38);
  auVar32 = ZEXT216(CONCAT11(uVar17,uVar17) & 0x7f7f);
  auVar32 = pshuflw(auVar32,auVar32,0);
  iVar38 = __return_storage_ptr__->first;
  bVar19 = __return_storage_ptr__->second;
  uVar30 = 0;
  do {
    pcVar25 = pcVar23 + uVar28;
    local_98 = *pcVar25;
    cStack_97 = pcVar25[1];
    cStack_96 = pcVar25[2];
    cStack_95 = pcVar25[3];
    uVar16 = *(undefined4 *)pcVar25;
    cVar4 = pcVar25[4];
    cVar5 = pcVar25[5];
    cVar6 = pcVar25[6];
    cVar7 = pcVar25[7];
    cVar8 = pcVar25[8];
    cVar9 = pcVar25[9];
    cVar10 = pcVar25[10];
    cVar11 = pcVar25[0xb];
    cVar12 = pcVar25[0xc];
    cVar13 = pcVar25[0xd];
    cVar14 = pcVar25[0xe];
    cVar15 = pcVar25[0xf];
    cVar31 = auVar32[0];
    auVar33[0] = -(cVar31 == local_98);
    cVar34 = auVar32[1];
    auVar33[1] = -(cVar34 == cStack_97);
    cVar35 = auVar32[2];
    auVar33[2] = -(cVar35 == cStack_96);
    cVar36 = auVar32[3];
    auVar33[3] = -(cVar36 == cStack_95);
    auVar33[4] = -(cVar31 == cVar4);
    auVar33[5] = -(cVar34 == cVar5);
    auVar33[6] = -(cVar35 == cVar6);
    auVar33[7] = -(cVar36 == cVar7);
    auVar33[8] = -(cVar31 == cVar8);
    auVar33[9] = -(cVar34 == cVar9);
    auVar33[10] = -(cVar35 == cVar10);
    auVar33[0xb] = -(cVar36 == cVar11);
    auVar33[0xc] = -(cVar31 == cVar12);
    auVar33[0xd] = -(cVar34 == cVar13);
    auVar33[0xe] = -(cVar35 == cVar14);
    auVar33[0xf] = -(cVar36 == cVar15);
    uVar20 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    uVar27 = (uint)uVar20;
    local_70 = iVar38.ctrl_;
    local_78 = iVar38.field_1;
    while (uVar20 != 0) {
      uVar2 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      local_40 = key;
      local_38 = this;
      psVar24 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      uVar29 = uVar2 + uVar28 & uVar1;
      bVar18 = EqualElement<char_const*>::operator()(&local_40,psVar24 + uVar29,psVar24 + uVar29);
      if (bVar18) {
        (__return_storage_ptr__->first).field_1 = local_78;
        __return_storage_ptr__->second = bVar19;
        (__return_storage_ptr__->first).ctrl_ = local_70;
        iVar38 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)this,uVar29);
        __return_storage_ptr__->first = iVar38;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar20 = (ushort)(uVar27 - 1) & (ushort)uVar27;
      uVar27 = CONCAT22((short)(uVar27 - 1 >> 0x10),uVar20);
      local_98 = (ctrl_t)uVar16;
      cStack_97 = (ctrl_t)((uint)uVar16 >> 8);
      cStack_96 = (ctrl_t)((uint)uVar16 >> 0x10);
      cStack_95 = (ctrl_t)((uint)uVar16 >> 0x18);
    }
    auVar37[0] = -(local_98 == kEmpty);
    auVar37[1] = -(cStack_97 == kEmpty);
    auVar37[2] = -(cStack_96 == kEmpty);
    auVar37[3] = -(cStack_95 == kEmpty);
    auVar37[4] = -(cVar4 == kEmpty);
    auVar37[5] = -(cVar5 == kEmpty);
    auVar37[6] = -(cVar6 == kEmpty);
    auVar37[7] = -(cVar7 == kEmpty);
    auVar37[8] = -(cVar8 == kEmpty);
    auVar37[9] = -(cVar9 == kEmpty);
    auVar37[10] = -(cVar10 == kEmpty);
    auVar37[0xb] = -(cVar11 == kEmpty);
    auVar37[0xc] = -(cVar12 == kEmpty);
    auVar37[0xd] = -(cVar13 == kEmpty);
    auVar37[0xe] = -(cVar14 == kEmpty);
    auVar37[0xf] = -(cVar15 == kEmpty);
    uVar20 = (ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe | (ushort)(auVar37[0xf] >> 7) << 0xf;
    sVar26 = *(size_t *)this;
    if (uVar20 == 0) {
      if (sVar26 == 0) goto LAB_00186e09;
      uVar29 = uVar30 + 0x10;
      if (sVar26 < uVar29) {
        (__return_storage_ptr__->first).field_1 = local_78;
        __return_storage_ptr__->second = bVar19;
        (__return_storage_ptr__->first).ctrl_ = local_70;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                     );
      }
      uVar28 = uVar28 + uVar30 + 0x10 & uVar1;
    }
    else {
      if (sVar26 == 0) {
LAB_00186e09:
        (__return_storage_ptr__->first).field_1 = local_78;
        __return_storage_ptr__->second = bVar19;
        (__return_storage_ptr__->first).ctrl_ = local_70;
        goto LAB_00186e14;
      }
      pcVar25 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      bVar19 = ShouldInsertBackwardsForDebug(sVar26,(size_t)common,pcVar25);
      if (bVar19) {
        uVar3 = 0xf;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar27 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar27 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar30;
      sVar26 = PrepareInsertNonSoo((container_internal *)this,common,uVar27 + uVar28 & uVar1,target,
                                   in_R9);
      iVar38 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this,sVar26);
      bVar19 = true;
      uVar29 = uVar30;
    }
    uVar30 = uVar29;
    if (uVar20 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar38.field_1;
      __return_storage_ptr__->second = bVar19;
      (__return_storage_ptr__->first).ctrl_ = iVar38.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }